

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_examples.c
# Opt level: O0

void test12_should_not_be_parsed(void)

{
  cJSON *item;
  size_t sVar1;
  char *actual;
  cJSON *tree;
  char *test12;
  
  item = cJSON_Parse("{ \"name\": ");
  if (item != (cJSON *)0x0) {
    UnityFail("Should fail to parse incomplete JSON.",0xbc);
  }
  sVar1 = strlen("{ \"name\": ");
  actual = cJSON_GetErrorPtr();
  UnityAssertEqualNumber
            ((UNITY_INT)("{ \"name\": " + sVar1),(UNITY_INT)actual,"Error pointer is incorrect.",
             0xbe,UNITY_DISPLAY_STYLE_HEX64);
  if (item != (cJSON *)0x0) {
    cJSON_Delete(item);
  }
  return;
}

Assistant:

static void test12_should_not_be_parsed(void)
{
    const char *test12 = "{ \"name\": ";
    cJSON *tree = NULL;

    tree = cJSON_Parse(test12);
    TEST_ASSERT_NULL_MESSAGE(tree, "Should fail to parse incomplete JSON.");

    TEST_ASSERT_EQUAL_PTR_MESSAGE(test12 + strlen(test12), cJSON_GetErrorPtr(), "Error pointer is incorrect.");

    if (tree != NULL)
    {
        cJSON_Delete(tree);
    }
}